

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgExoticQuadrature.hpp
# Opt level: O3

CustomTabulated *
TasGrid::getExoticQuadrature
          (CustomTabulated *__return_storage_ptr__,int num_levels,double shift,
          function<double_(double)> *weight_fn,int num_ref_points,char *description,
          bool is_symmetric)

{
  pointer __first;
  pointer __last;
  pointer __result;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  invalid_argument *this;
  long lVar2;
  long lVar3;
  undefined7 in_register_00000089;
  vector<double,_std::allocator<double>_> shifted_weights;
  vector<double,_std::allocator<double>_> ref_points;
  vector<double,_std::allocator<double>_> weight_fn_vals;
  allocator_type local_b9;
  vector<double,_std::allocator<double>_> local_b8;
  undefined4 local_9c;
  vector<double,_std::allocator<double>_> local_98;
  double local_78;
  vector<double,_std::allocator<double>_> local_70;
  char *local_58;
  _Any_data local_50;
  _Manager_type local_40;
  
  local_9c = (undefined4)CONCAT71(in_register_00000089,is_symmetric);
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_78 = shift;
  local_58 = description;
  std::vector<double,_std::allocator<double>_>::vector(&local_70,(long)num_ref_points,&local_b9);
  TasGrid::OneDimensionalNodes::getGaussLegendre
            (num_ref_points,(vector *)&local_b8,(vector *)&local_98);
  __result = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  __last = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::function<double_(double)>::function((function<double_(double)> *)&local_50,weight_fn);
  std::
  transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::function<double(double)>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)__first,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)__last,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)__result,
             (function<double_(double)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if ((long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_negate<TasGrid::shiftReferenceWeights(std::vector<double,std::allocator<double>>const&,double,std::vector<double,std::allocator<double>>&)::_lambda(double)_1_>>
                      (local_78);
    if (_Var1._M_current ==
        local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      if ((long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar2 = (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        lVar3 = 0;
        do {
          local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] =
               (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3] + local_78) *
               local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
      }
      getShiftedExoticQuadrature
                (__return_storage_ptr__,num_levels,local_78,&local_b8,&local_98,local_58,
                 local_9c._0_1_);
      if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this,"ERROR: shift needs to be chosen so that weight_fn(x)+shift is nonnegative!");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __assert_fail("ref_weights.size() == vals.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgExoticQuadrature.hpp"
                ,299,
                "void TasGrid::shiftReferenceWeights(const std::vector<double> &, double, std::vector<double> &)"
               );
}

Assistant:

inline TasGrid::CustomTabulated getExoticQuadrature(const int num_levels, const double shift, std::function<double(double)> weight_fn,
                                                    const int num_ref_points, const char* description, const bool is_symmetric = false) {
    std::vector<double> shifted_weights, ref_points, weight_fn_vals(num_ref_points);
    TasGrid::OneDimensionalNodes::getGaussLegendre(num_ref_points, shifted_weights, ref_points);
    std::transform(ref_points.begin(), ref_points.end(), weight_fn_vals.begin(), weight_fn);
    shiftReferenceWeights(weight_fn_vals, shift, shifted_weights);
    return getShiftedExoticQuadrature(num_levels, shift, shifted_weights, ref_points, description, is_symmetric);
}